

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Covariance4D.hpp
# Opt level: O0

void __thiscall
Covariance::Covariance4D<Vector,_double>::SpatialFilter
          (Covariance4D<Vector,_double> *this,double *sxx,double *sxy,double *syy)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  const_reference pvVar5;
  undefined4 *puVar6;
  double *in_RCX;
  double *in_RDX;
  double *in_RSI;
  double dVar7;
  double dVar8;
  double det;
  double inverse [16];
  size_type in_stack_ffffffffffffff38;
  array<double,_10UL> *in_stack_ffffffffffffff40;
  int size;
  double *A;
  
  pvVar5 = std::array<double,_10UL>::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff38)
  ;
  dVar1 = *pvVar5;
  pvVar5 = std::array<double,_10UL>::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff38)
  ;
  dVar2 = *pvVar5;
  pvVar5 = std::array<double,_10UL>::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff38)
  ;
  A = (double *)*pvVar5;
  pvVar5 = std::array<double,_10UL>::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff38)
  ;
  dVar3 = *pvVar5;
  std::array<double,_10UL>::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::array<double,_10UL>::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::array<double,_10UL>::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::array<double,_10UL>::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::array<double,_10UL>::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  pvVar5 = std::array<double,_10UL>::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff38)
  ;
  size = (int)((ulong)*pvVar5 >> 0x20);
  std::array<double,_10UL>::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::array<double,_10UL>::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::array<double,_10UL>::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::array<double,_10UL>::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::array<double,_10UL>::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::array<double,_10UL>::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  bVar4 = Inverse<double>(A,size);
  if (!bVar4) {
    puVar6 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar6 = 1;
    __cxa_throw(puVar6,&int::typeinfo,0);
  }
  dVar7 = (dVar1 + 1e-05) * (dVar3 + 1e-05) + -(dVar2 * dVar2);
  dVar8 = pow(6.283185307179586,2.0);
  dVar7 = dVar7 / dVar8;
  *in_RSI = (dVar3 + 1e-05) / dVar7;
  *in_RCX = (dVar1 + 1e-05) / dVar7;
  *in_RDX = -dVar2 / dVar7;
  return;
}

Assistant:

void SpatialFilter(Float& sxx, Float& sxy, Float& syy) const {

         // Compute the inverse matrix. We need to add an epsilon to the
         // diagonal in order to ensure that the matrix can be inverted.
         Float inverse[16];
         inverse[ 0] = matrix[ 0] + COV_MIN_FLOAT;
         inverse[ 1] = matrix[ 1]; inverse[ 4] = matrix[ 1];
         inverse[ 5] = matrix[ 2] + COV_MIN_FLOAT;
         inverse[ 2] = matrix[ 3]; inverse[ 8] = matrix[ 3];
         inverse[ 6] = matrix[ 4]; inverse[ 9] = matrix[ 4];
         inverse[10] = matrix[ 5] + COV_MIN_FLOAT;
         inverse[ 3] = matrix[ 6]; inverse[12] = matrix[ 6];
         inverse[ 7] = matrix[ 7]; inverse[13] = matrix[ 7];
         inverse[11] = matrix[ 8]; inverse[14] = matrix[ 8];
         inverse[15] = matrix[ 9] + COV_MIN_FLOAT;

         if(!Inverse<Float>(inverse, 4)) { throw 1; }

         // The outgoing filter is the inverse submatrix of this inverse
         // matrix.
         Float det = (inverse[0]*inverse[5]-inverse[1]*inverse[1]) / pow(2.0*M_PI, 2);
         sxx =  inverse[5] / det;
         syy =  inverse[0] / det;
         sxy = -inverse[1] / det;
      }